

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

opj_image_t *
rawtoimage_common(char *filename,opj_cparameters_t *parameters,raw_cparameters_t *raw_cp,
                 OPJ_BOOL big_endian)

{
  size_t sVar1;
  uint local_84;
  uint local_80;
  byte local_7a;
  byte local_79;
  int local_78;
  uchar temp2;
  uchar temp1;
  int nloop_1;
  byte local_6b;
  unsigned_short value_1;
  int nloop;
  uchar value;
  unsigned_short ch;
  opj_image_t *image;
  opj_image_cmptparm_t *cmptparm;
  OPJ_COLOR_SPACE color_space;
  int h;
  int w;
  int numcomps;
  int compno;
  int i;
  FILE *f;
  int local_30;
  int subsampling_dy;
  int subsampling_dx;
  OPJ_BOOL big_endian_local;
  raw_cparameters_t *raw_cp_local;
  opj_cparameters_t *parameters_local;
  char *filename_local;
  
  local_30 = parameters->subsampling_dx;
  f._4_4_ = parameters->subsampling_dy;
  _compno = (FILE *)0x0;
  _nloop = (int *)0x0;
  subsampling_dy = big_endian;
  _subsampling_dx = raw_cp;
  raw_cp_local = (raw_cparameters_t *)parameters;
  parameters_local = (opj_cparameters_t *)filename;
  if ((raw_cp->rawWidth & raw_cp->rawHeight & raw_cp->rawComp & raw_cp->rawBitDepth) == 0) {
    _compno = fopen(filename,"rb");
    if (_compno == (FILE *)0x0) {
      fprintf(_stderr,"Failed to open %s for reading !!\n",parameters_local);
      fprintf(_stderr,"Aborting\n");
      filename_local = (char *)0x0;
    }
    else {
      h = _subsampling_dx->rawComp;
      if (h == 1) {
        cmptparm._0_4_ = 2;
      }
      else if ((h < 3) || (*(char *)((long)&raw_cp_local[0x248].rawComp + 2) != '\0')) {
        if ((h < 3) || (*(char *)((long)&raw_cp_local[0x248].rawComp + 2) == '\x02')) {
          cmptparm._0_4_ = 0xffffffff;
        }
        else {
          cmptparm._0_4_ = 1;
        }
      }
      else {
        cmptparm._0_4_ = 3;
      }
      color_space = _subsampling_dx->rawWidth;
      cmptparm._4_4_ = _subsampling_dx->rawHeight;
      image = (opj_image_t *)calloc((ulong)(uint)h,0x24);
      if (image == (opj_image_t *)0x0) {
        fprintf(_stderr,"Failed to allocate image components parameters !!\n");
        fprintf(_stderr,"Aborting\n");
        fclose(_compno);
        filename_local = (char *)0x0;
      }
      else {
        for (numcomps = 0; numcomps < h; numcomps = numcomps + 1) {
          *(int *)((long)&image->comps + (long)numcomps * 0x24) = _subsampling_dx->rawBitDepth;
          *(OPJ_BOOL *)((long)&image->icc_profile_buf + (long)numcomps * 0x24) =
               _subsampling_dx->rawSigned;
          (&image->x0)[(long)numcomps * 9] = local_30 * _subsampling_dx->rawComps[numcomps].dx;
          (&image->y0)[(long)numcomps * 9] = f._4_4_ * _subsampling_dx->rawComps[numcomps].dy;
          (&image->x1)[(long)numcomps * 9] = color_space;
          (&image->y1)[(long)numcomps * 9] = cmptparm._4_4_;
        }
        _nloop = (int *)opj_image_create(h,image,cmptparm._0_4_);
        free(image);
        if (_nloop == (int *)0x0) {
          fclose(_compno);
          filename_local = (char *)0x0;
        }
        else {
          *_nloop = raw_cp_local[0x238].rawBitDepth;
          _nloop[1] = raw_cp_local[0x238].rawSigned;
          _nloop[2] = raw_cp_local[0x238].rawBitDepth +
                      (color_space + OPJ_CLRSPC_UNKNOWN) * local_30 + 1;
          _nloop[3] = raw_cp_local[0x238].rawSigned + (cmptparm._4_4_ - 1) * f._4_4_ + 1;
          if (_subsampling_dx->rawBitDepth < 9) {
            local_6b = 0;
            for (w = 0; w < h; w = w + 1) {
              nloop_1 = (color_space * cmptparm._4_4_) /
                        (_subsampling_dx->rawComps[w].dx * _subsampling_dx->rawComps[w].dy);
              for (numcomps = 0; numcomps < nloop_1; numcomps = numcomps + 1) {
                sVar1 = fread(&local_6b,1,1,_compno);
                if (sVar1 == 0) {
                  fprintf(_stderr,"Error reading raw file. End of file probably reached.\n");
                  opj_image_destroy(_nloop);
                  fclose(_compno);
                  return (opj_image_t *)0x0;
                }
                if (_subsampling_dx->rawSigned == 0) {
                  local_80 = (uint)local_6b;
                }
                else {
                  local_80 = (uint)(char)local_6b;
                }
                *(uint *)(*(long *)(*(long *)(_nloop + 6) + (long)w * 0x40 + 0x30) +
                         (long)numcomps * 4) = local_80;
              }
            }
          }
          else {
            if (0x10 < _subsampling_dx->rawBitDepth) {
              fprintf(_stderr,
                      "OpenJPEG cannot encode raw components with bit depth higher than 16 bits.\n")
              ;
              opj_image_destroy(_nloop);
              fclose(_compno);
              return (opj_image_t *)0x0;
            }
            for (w = 0; w < h; w = w + 1) {
              local_78 = (color_space * cmptparm._4_4_) /
                         (_subsampling_dx->rawComps[w].dx * _subsampling_dx->rawComps[w].dy);
              for (numcomps = 0; numcomps < local_78; numcomps = numcomps + 1) {
                sVar1 = fread(&local_79,1,1,_compno);
                if (sVar1 == 0) {
                  fprintf(_stderr,"Error reading raw file. End of file probably reached.\n");
                  opj_image_destroy(_nloop);
                  fclose(_compno);
                  return (opj_image_t *)0x0;
                }
                sVar1 = fread(&local_7a,1,1,_compno);
                if (sVar1 == 0) {
                  fprintf(_stderr,"Error reading raw file. End of file probably reached.\n");
                  opj_image_destroy(_nloop);
                  fclose(_compno);
                  return (opj_image_t *)0x0;
                }
                if (subsampling_dy == 0) {
                  _temp2 = (ushort)local_7a * 0x100 + (ushort)local_79;
                }
                else {
                  _temp2 = (ushort)local_79 * 0x100 + (ushort)local_7a;
                }
                if (_subsampling_dx->rawSigned == 0) {
                  local_84 = (uint)_temp2;
                }
                else {
                  local_84 = (uint)(short)_temp2;
                }
                *(uint *)(*(long *)(*(long *)(_nloop + 6) + (long)w * 0x40 + 0x30) +
                         (long)numcomps * 4) = local_84;
              }
            }
          }
          sVar1 = fread(&value_1,1,1,_compno);
          if (sVar1 != 0) {
            fprintf(_stderr,"Warning. End of raw file not reached... processing anyway\n");
          }
          fclose(_compno);
          filename_local = (char *)_nloop;
        }
      }
    }
  }
  else {
    fprintf(_stderr,"\nError: invalid raw image parameters\n");
    fprintf(_stderr,"Please use the Format option -F:\n");
    fprintf(_stderr,"-F <width>,<height>,<ncomp>,<bitdepth>,{s,u}@<dx1>x<dy1>:...:<dxn>x<dyn>\n");
    fprintf(_stderr,"If subsampling is omitted, 1x1 is assumed for all components\n");
    fprintf(_stderr,"Example: -i image.raw -o image.j2k -F 512,512,3,8,u@1x1:2x2:2x2\n");
    fprintf(_stderr,"         for raw 512x512 image with 4:2:0 subsampling\n");
    fprintf(_stderr,"Aborting.\n");
    filename_local = (char *)0x0;
  }
  return (opj_image_t *)filename_local;
}

Assistant:

static opj_image_t* rawtoimage_common(const char *filename,
                                      opj_cparameters_t *parameters, raw_cparameters_t *raw_cp, OPJ_BOOL big_endian)
{
    int subsampling_dx = parameters->subsampling_dx;
    int subsampling_dy = parameters->subsampling_dy;

    FILE *f = NULL;
    int i, compno, numcomps, w, h;
    OPJ_COLOR_SPACE color_space;
    opj_image_cmptparm_t *cmptparm;
    opj_image_t * image = NULL;
    unsigned short ch;

    if ((!(raw_cp->rawWidth & raw_cp->rawHeight & raw_cp->rawComp &
            raw_cp->rawBitDepth)) == 0) {
        fprintf(stderr, "\nError: invalid raw image parameters\n");
        fprintf(stderr, "Please use the Format option -F:\n");
        fprintf(stderr,
                "-F <width>,<height>,<ncomp>,<bitdepth>,{s,u}@<dx1>x<dy1>:...:<dxn>x<dyn>\n");
        fprintf(stderr,
                "If subsampling is omitted, 1x1 is assumed for all components\n");
        fprintf(stderr,
                "Example: -i image.raw -o image.j2k -F 512,512,3,8,u@1x1:2x2:2x2\n");
        fprintf(stderr, "         for raw 512x512 image with 4:2:0 subsampling\n");
        fprintf(stderr, "Aborting.\n");
        return NULL;
    }

    f = fopen(filename, "rb");
    if (!f) {
        fprintf(stderr, "Failed to open %s for reading !!\n", filename);
        fprintf(stderr, "Aborting\n");
        return NULL;
    }
    numcomps = raw_cp->rawComp;

    /* FIXME ADE at this point, tcp_mct has not been properly set in calling function */
    if (numcomps == 1) {
        color_space = OPJ_CLRSPC_GRAY;
    } else if ((numcomps >= 3) && (parameters->tcp_mct == 0)) {
        color_space = OPJ_CLRSPC_SYCC;
    } else if ((numcomps >= 3) && (parameters->tcp_mct != 2)) {
        color_space = OPJ_CLRSPC_SRGB;
    } else {
        color_space = OPJ_CLRSPC_UNKNOWN;
    }
    w = raw_cp->rawWidth;
    h = raw_cp->rawHeight;
    cmptparm = (opj_image_cmptparm_t*) calloc((OPJ_UINT32)numcomps,
               sizeof(opj_image_cmptparm_t));
    if (!cmptparm) {
        fprintf(stderr, "Failed to allocate image components parameters !!\n");
        fprintf(stderr, "Aborting\n");
        fclose(f);
        return NULL;
    }
    /* initialize image components */
    for (i = 0; i < numcomps; i++) {
        cmptparm[i].prec = (OPJ_UINT32)raw_cp->rawBitDepth;
        cmptparm[i].sgnd = (OPJ_UINT32)raw_cp->rawSigned;
        cmptparm[i].dx = (OPJ_UINT32)(subsampling_dx * raw_cp->rawComps[i].dx);
        cmptparm[i].dy = (OPJ_UINT32)(subsampling_dy * raw_cp->rawComps[i].dy);
        cmptparm[i].w = (OPJ_UINT32)w;
        cmptparm[i].h = (OPJ_UINT32)h;
    }
    /* create the image */
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm[0], color_space);
    free(cmptparm);
    if (!image) {
        fclose(f);
        return NULL;
    }
    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = (OPJ_UINT32)parameters->image_offset_x0 + (OPJ_UINT32)(w - 1) *
                (OPJ_UINT32)subsampling_dx + 1;
    image->y1 = (OPJ_UINT32)parameters->image_offset_y0 + (OPJ_UINT32)(h - 1) *
                (OPJ_UINT32)subsampling_dy + 1;

    if (raw_cp->rawBitDepth <= 8) {
        unsigned char value = 0;
        for (compno = 0; compno < numcomps; compno++) {
            int nloop = (w * h) / (raw_cp->rawComps[compno].dx *
                                   raw_cp->rawComps[compno].dy);
            for (i = 0; i < nloop; i++) {
                if (!fread(&value, 1, 1, f)) {
                    fprintf(stderr, "Error reading raw file. End of file probably reached.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                image->comps[compno].data[i] = raw_cp->rawSigned ? (char)value : value;
            }
        }
    } else if (raw_cp->rawBitDepth <= 16) {
        unsigned short value;
        for (compno = 0; compno < numcomps; compno++) {
            int nloop = (w * h) / (raw_cp->rawComps[compno].dx *
                                   raw_cp->rawComps[compno].dy);
            for (i = 0; i < nloop; i++) {
                unsigned char temp1;
                unsigned char temp2;
                if (!fread(&temp1, 1, 1, f)) {
                    fprintf(stderr, "Error reading raw file. End of file probably reached.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&temp2, 1, 1, f)) {
                    fprintf(stderr, "Error reading raw file. End of file probably reached.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (big_endian) {
                    value = (unsigned short)((temp1 << 8) + temp2);
                } else {
                    value = (unsigned short)((temp2 << 8) + temp1);
                }
                image->comps[compno].data[i] = raw_cp->rawSigned ? (short)value : value;
            }
        }
    } else {
        fprintf(stderr,
                "OpenJPEG cannot encode raw components with bit depth higher than 16 bits.\n");
        opj_image_destroy(image);
        fclose(f);
        return NULL;
    }

    if (fread(&ch, 1, 1, f)) {
        fprintf(stderr, "Warning. End of raw file not reached... processing anyway\n");
    }
    fclose(f);

    return image;
}